

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer
          (cmQtAutoGenGlobalInitializer *this,
          vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
          *localGenerators)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  cmMakefile *this_00;
  cmLocalGenerator *pcVar3;
  pointer puVar4;
  __uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true> target;
  cmQtAutoGenGlobalInitializer *this_01;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  TargetType TVar8;
  string *psVar9;
  size_type sVar10;
  string *psVar11;
  undefined1 rcc;
  string *in_R8;
  pointer puVar12;
  pointer puVar13;
  byte bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool rccIsValid;
  bool uicIsValid;
  bool mocIsValid;
  bool globalAutoRccTarget;
  bool globalAutoGenTarget;
  cmQtAutoGenGlobalInitializer *local_208;
  string *local_200;
  bool local_1f8 [16];
  _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
  *local_1e8;
  _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
  *local_1e0;
  string *local_1d8;
  cmAlphaNum version;
  string targetName;
  cmAlphaNum component;
  cmAlphaNum local_f0;
  string local_c0;
  cmAlphaNum local_a0;
  string msg;
  string local_50;
  
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0 = (_Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
               *)&this->GlobalAutoGenTargets_;
  p_Var1 = &(this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1e8 = (_Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
               *)&this->GlobalAutoRccTargets_;
  (this->CompilerFeatures_)._M_h._M_buckets = &(this->CompilerFeatures_)._M_h._M_single_bucket;
  (this->CompilerFeatures_)._M_h._M_bucket_count = 1;
  (this->CompilerFeatures_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->CompilerFeatures_)._M_h._M_element_count = 0;
  (this->CompilerFeatures_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->CompilerFeatures_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->CompilerFeatures_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  psVar11 = &(this->Keywords_).AUTOMOC;
  Keywords::Keywords((Keywords *)psVar11);
  puVar12 = (localGenerators->
            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (localGenerators->
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_208 = this;
  local_200 = psVar11;
  while( true ) {
    if (puVar12 == puVar2) break;
    globalAutoGenTarget = false;
    globalAutoRccTarget = false;
    this_00 = ((puVar12->_M_t).
               super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetName,"CMAKE_GLOBAL_AUTOGEN_TARGET",(allocator<char> *)&version);
    bVar5 = cmMakefile::IsOn(this_00,&targetName);
    std::__cxx11::string::~string((string *)&targetName);
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&version,"CMAKE_GLOBAL_AUTOGEN_TARGET_NAME",(allocator<char> *)&component
                );
      psVar9 = cmMakefile::GetSafeDefinition(this_00,(string *)&version);
      std::__cxx11::string::string((string *)&targetName,(string *)psVar9);
      std::__cxx11::string::~string((string *)&version);
      if (targetName._M_string_length == 0) {
        std::__cxx11::string::assign((char *)&targetName);
      }
      version.View_._M_len =
           (size_t)(puVar12->_M_t).
                   super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                   .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
      std::
      _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
      ::_M_emplace_unique<cmLocalGenerator*,std::__cxx11::string>
                (local_1e0,(cmLocalGenerator **)&version,&targetName);
      globalAutoGenTarget = true;
      std::__cxx11::string::~string((string *)&targetName);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetName,"CMAKE_GLOBAL_AUTORCC_TARGET",(allocator<char> *)&version);
    bVar5 = cmMakefile::IsOn(this_00,&targetName);
    std::__cxx11::string::~string((string *)&targetName);
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&version,"CMAKE_GLOBAL_AUTORCC_TARGET_NAME",(allocator<char> *)&component
                );
      psVar9 = cmMakefile::GetSafeDefinition(this_00,(string *)&version);
      std::__cxx11::string::string((string *)&targetName,(string *)psVar9);
      std::__cxx11::string::~string((string *)&version);
      if (targetName._M_string_length == 0) {
        std::__cxx11::string::assign((char *)&targetName);
      }
      version.View_._M_len =
           (size_t)(puVar12->_M_t).
                   super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                   .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
      std::
      _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
      ::_M_emplace_unique<cmLocalGenerator*,std::__cxx11::string>
                (local_1e8,(cmLocalGenerator **)&version,&targetName);
      globalAutoRccTarget = true;
      std::__cxx11::string::~string((string *)&targetName);
    }
    pcVar3 = (puVar12->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
             super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
    puVar13 = *(pointer *)
               &(pcVar3->GeneratorTargets).
                super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                ._M_impl;
    puVar4 = *(pointer *)
              ((long)&(pcVar3->GeneratorTargets).
                      super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
              + 8);
    while( true ) {
      if (puVar13 == puVar4) break;
      TVar8 = cmGeneratorTarget::GetType
                        ((cmGeneratorTarget *)
                         (puVar13->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                        );
      if ((TVar8 < UTILITY) &&
         (bVar5 = cmGeneratorTarget::IsImported
                            ((cmGeneratorTarget *)
                             (puVar13->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                            ), !bVar5)) {
        cmGeneratorTarget::GetAllConfigCompileLanguages_abi_cxx11_
                  ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&targetName,
                   (cmGeneratorTarget *)
                   (puVar13->_M_t).
                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                  );
        cmGeneratorTarget::ClearSourcesCache
                  ((cmGeneratorTarget *)
                   (puVar13->_M_t).
                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                  );
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&version,"CSharp",(allocator<char> *)&component);
        sVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&targetName,(key_type *)&version);
        std::__cxx11::string::~string((string *)&version);
        if (sVar10 == 0) {
          bVar5 = cmGeneratorTarget::GetPropertyAsBool
                            ((cmGeneratorTarget *)
                             (puVar13->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ,psVar11);
          bVar6 = cmGeneratorTarget::GetPropertyAsBool
                            ((cmGeneratorTarget *)
                             (puVar13->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ,&(this->Keywords_).AUTOUIC);
          bVar7 = cmGeneratorTarget::GetPropertyAsBool
                            ((cmGeneratorTarget *)
                             (puVar13->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ,&(this->Keywords_).AUTORCC);
          if ((bVar5 || bVar6) || bVar7) {
            local_1d8 = cmGeneratorTarget::GetSafeProperty
                                  ((cmGeneratorTarget *)
                                   (puVar13->_M_t).
                                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                   ,&(this->Keywords_).AUTOMOC_EXECUTABLE);
            psVar11 = cmGeneratorTarget::GetSafeProperty
                                ((cmGeneratorTarget *)
                                 (puVar13->_M_t).
                                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                 ,&(this->Keywords_).AUTOUIC_EXECUTABLE);
            psVar9 = cmGeneratorTarget::GetSafeProperty
                               ((cmGeneratorTarget *)
                                (puVar13->_M_t).
                                super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                ,&(this->Keywords_).AUTORCC_EXECUTABLE);
            target.super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
            super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
                 (puVar13->_M_t).
                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>;
            std::__cxx11::string::string((string *)&local_50,(string *)local_1d8);
            local_1f8._0_12_ =
                 (undefined1  [12])
                 cmQtAutoGenInitializer::GetQtVersion
                           ((cmGeneratorTarget *)
                            target.
                            super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                            .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                            &local_50);
            std::__cxx11::string::~string((string *)&local_50);
            rcc = SUB81(in_R8,0);
            bVar16 = true;
            bVar15 = true;
            bVar17 = true;
            if (2 < local_1f8._0_4_ - 4) {
              bVar15 = local_1d8->_M_string_length != 0;
              bVar16 = psVar11->_M_string_length != 0;
              bVar17 = psVar9->_M_string_length != 0;
            }
            mocIsValid = (bool)(bVar5 & bVar15);
            uicIsValid = (bool)(bVar6 & bVar16);
            rccIsValid = (bool)(bVar7 & bVar17);
            bVar14 = (bVar15 ^ 1U) & bVar5;
            bVar6 = (bool)((bVar16 ^ 1U) & bVar6);
            bVar7 = (bool)((bVar17 ^ 1U) & bVar7);
            if (((bVar6 != false) || (bVar14 != 0)) ||
               (this_01 = local_208, psVar11 = local_200, bVar5 = mocIsValid, bVar7 != false)) {
              if (local_1f8._8_4_ == 0) {
                version.View_._M_len = 0xb;
                version.View_._M_str = "<QTVERSION>";
              }
              else {
                cmAlphaNum::cmAlphaNum(&version,local_1f8._8_4_);
              }
              component.View_._M_str = "Core";
              if (bVar6 != false) {
                component.View_._M_str = "Widgets";
              }
              component.View_._M_len = (ulong)bVar6 * 3 + 4;
              local_f0.View_._M_len = 0x2e;
              local_f0.View_._M_str = "AUTOGEN: No valid Qt version found for target ";
              psVar11 = cmGeneratorTarget::GetName_abi_cxx11_
                                  ((cmGeneratorTarget *)
                                   (puVar13->_M_t).
                                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                  );
              local_a0.View_._M_str = (psVar11->_M_dataplus)._M_p;
              local_a0.View_._M_len = psVar11->_M_string_length;
              cmQtAutoGen::Tools_abi_cxx11_
                        (&local_c0,(cmQtAutoGen *)(ulong)bVar14,bVar6,bVar7,(bool)rcc);
              psVar11 = local_200;
              this_01 = local_208;
              in_R8 = &local_c0;
              cmStrCat<char[4],std::__cxx11::string,char[30],char[18],cmAlphaNum,char[13],cmAlphaNum,char[3],char[29]>
                        (&msg,&local_f0,&local_a0,(char (*) [4])0x617e31,&local_c0,
                         (char (*) [30])" disabled.  Consider adding:\n",
                         (char (*) [18])"  find_package(Qt",&version,(char (*) [13])" COMPONENTS ",
                         &component,(char (*) [3])0x641bed,
                         (char (*) [29])"to your CMakeLists.txt file.");
              std::__cxx11::string::~string((string *)&local_c0);
              cmMakefile::IssueMessage
                        (*(cmMakefile **)
                          ((long)(puVar13->_M_t).
                                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          + 8),AUTHOR_WARNING,&msg);
              std::__cxx11::string::~string((string *)&msg);
              bVar5 = (bool)(mocIsValid & 1);
            }
            if (((bVar5 != false) || (uicIsValid != false)) || (rccIsValid == true)) {
              local_f0.View_._M_len =
                   *(size_t *)
                    &(puVar13->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
              ;
              in_R8 = (string *)&mocIsValid;
              component.View_._M_len = (size_t)this_01;
              std::
              make_unique<cmQtAutoGenInitializer,cmQtAutoGenGlobalInitializer*,cmGeneratorTarget*,cmQtAutoGen::IntegerVersion&,bool_const&,bool_const&,bool_const&,bool&,bool&>
                        ((cmQtAutoGenGlobalInitializer **)&version,(cmGeneratorTarget **)&component,
                         (IntegerVersion *)&local_f0,local_1f8,(bool *)in_R8,&uicIsValid,&rccIsValid
                         ,&globalAutoGenTarget);
              std::
              vector<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>>
              ::
              emplace_back<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>
                        ((vector<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>>
                          *)this_01,
                         (unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                          *)&version);
              std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
              ::~unique_ptr((unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                             *)&version);
            }
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&targetName);
      }
      puVar13 = puVar13 + 1;
    }
    puVar12 = puVar12 + 1;
  }
  return;
}

Assistant:

cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer(
  std::vector<std::unique_ptr<cmLocalGenerator>> const& localGenerators)
{
  for (const auto& localGen : localGenerators) {
    // Detect global autogen and autorcc target names
    bool globalAutoGenTarget = false;
    bool globalAutoRccTarget = false;
    {
      cmMakefile* makefile = localGen->GetMakefile();
      // Detect global autogen target name
      if (makefile->IsOn("CMAKE_GLOBAL_AUTOGEN_TARGET")) {
        std::string targetName =
          makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTOGEN_TARGET_NAME");
        if (targetName.empty()) {
          targetName = "autogen";
        }
        this->GlobalAutoGenTargets_.emplace(localGen.get(),
                                            std::move(targetName));
        globalAutoGenTarget = true;
      }

      // Detect global autorcc target name
      if (makefile->IsOn("CMAKE_GLOBAL_AUTORCC_TARGET")) {
        std::string targetName =
          makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTORCC_TARGET_NAME");
        if (targetName.empty()) {
          targetName = "autorcc";
        }
        this->GlobalAutoRccTargets_.emplace(localGen.get(),
                                            std::move(targetName));
        globalAutoRccTarget = true;
      }
    }

    // Find targets that require AUTOMOC/UIC/RCC processing
    for (const auto& target : localGen->GetGeneratorTargets()) {
      // Process only certain target types
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY:
          // Process target
          break;
        default:
          // Don't process target
          continue;
      }
      if (target->IsImported()) {
        // Don't process target
        continue;
      }
      std::set<std::string> const& languages =
        target->GetAllConfigCompileLanguages();
      // cmGeneratorTarget::GetAllConfigCompileLanguages caches the target's
      // sources. Clear it so that OBJECT library targets that are AUTOGEN
      // initialized after this target get their added mocs_compilation.cpp
      // source acknowledged by this target.
      target->ClearSourcesCache();
      if (languages.count("CSharp")) {
        // Don't process target if it's a CSharp target
        continue;
      }

      bool const moc = target->GetPropertyAsBool(this->kw().AUTOMOC);
      bool const uic = target->GetPropertyAsBool(this->kw().AUTOUIC);
      bool const rcc = target->GetPropertyAsBool(this->kw().AUTORCC);
      if (moc || uic || rcc) {
        std::string const& mocExec =
          target->GetSafeProperty(this->kw().AUTOMOC_EXECUTABLE);
        std::string const& uicExec =
          target->GetSafeProperty(this->kw().AUTOUIC_EXECUTABLE);
        std::string const& rccExec =
          target->GetSafeProperty(this->kw().AUTORCC_EXECUTABLE);

        // We support Qt4, Qt5 and Qt6
        auto qtVersion =
          cmQtAutoGenInitializer::GetQtVersion(target.get(), mocExec);
        bool const validQt = (qtVersion.first.Major == 4) ||
          (qtVersion.first.Major == 5) || (qtVersion.first.Major == 6);

        bool const mocAvailable = (validQt || !mocExec.empty());
        bool const uicAvailable = (validQt || !uicExec.empty());
        bool const rccAvailable = (validQt || !rccExec.empty());
        bool const mocIsValid = (moc && mocAvailable);
        bool const uicIsValid = (uic && uicAvailable);
        bool const rccIsValid = (rcc && rccAvailable);
        // Disabled AUTOMOC/UIC/RCC warning
        bool const mocDisabled = (moc && !mocAvailable);
        bool const uicDisabled = (uic && !uicAvailable);
        bool const rccDisabled = (rcc && !rccAvailable);
        if (mocDisabled || uicDisabled || rccDisabled) {
          cmAlphaNum version = (qtVersion.second == 0)
            ? cmAlphaNum("<QTVERSION>")
            : cmAlphaNum(qtVersion.second);
          cmAlphaNum component = uicDisabled ? "Widgets" : "Core";

          std::string const msg = cmStrCat(
            "AUTOGEN: No valid Qt version found for target ",
            target->GetName(), ".  ",
            cmQtAutoGen::Tools(mocDisabled, uicDisabled, rccDisabled),
            " disabled.  Consider adding:\n", "  find_package(Qt", version,
            " COMPONENTS ", component, ")\n", "to your CMakeLists.txt file.");
          target->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
        }
        if (mocIsValid || uicIsValid || rccIsValid) {
          // Create autogen target initializer
          this->Initializers_.emplace_back(
            cm::make_unique<cmQtAutoGenInitializer>(
              this, target.get(), qtVersion.first, mocIsValid, uicIsValid,
              rccIsValid, globalAutoGenTarget, globalAutoRccTarget));
        }
      }
    }
  }
}